

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Monitor.h
# Opt level: O0

void __thiscall Monitor::start(Monitor *this)

{
  long in_RDI;
  
  *(undefined4 *)(in_RDI + 0x10) = 0;
  gettimeofday((timeval *)(in_RDI + 0x18),(__timezone_ptr_t)0x0);
  return;
}

Assistant:

inline void start() {
		stopped = 0; // reset stop flag
		#ifdef _WIN32
		QueryPerformanceCounter(&startCount);
		#else
		gettimeofday(&startCount, NULL);
		#endif
	}